

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

shared_ptr<Handler> __thiscall
GameEngine::generateBotHandlersChain(GameEngine *this,shared_ptr<Player> *bot)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  TypeName TVar6;
  ParamType size;
  element_type *peVar7;
  size_t sVar8;
  element_type *peVar9;
  RandomGenerator *pRVar10;
  Config *this_00;
  element_type *peVar11;
  element_type *peVar12;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar13;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var14;
  element_type *peVar15;
  __shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar16;
  reference pvVar17;
  __shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Handler> sVar18;
  shared_ptr<Handler> local_1e0;
  shared_ptr<Population> local_1d0;
  shared_ptr<Population> local_1c0;
  shared_ptr<Population> local_1b0;
  shared_ptr<MoveHandler> local_1a0;
  undefined1 local_190 [8];
  shared_ptr<Population> newPopulation;
  shared_ptr<VelocityMutationHandler> local_170;
  shared_ptr<Population> local_160;
  pair<int,_int> local_150;
  shared_ptr<Population> local_148;
  shared_ptr<Population> local_138;
  shared_ptr<Population> local_128;
  shared_ptr<Population> local_118;
  pair<int,_int> local_108;
  shared_ptr<MoveHandler> local_100;
  shared_ptr<Population> local_f0;
  shared_ptr<VelocityMutationHandler> local_e0;
  shared_ptr<SizeMutationHandler> local_d0;
  shared_ptr<SafetyMutationHandler> local_c0;
  shared_ptr<CoverMutationHandler> local_b0;
  int local_a0;
  int32_t local_9c;
  int32_t handlerType;
  int32_t mutationType;
  pair<int,_int> pos;
  int32_t dY;
  int32_t dX;
  int32_t y;
  int32_t x;
  shared_ptr<Handler> link;
  undefined1 local_60 [8];
  shared_ptr<Population> tempPopulation;
  int32_t i;
  undefined1 local_38 [4];
  int32_t populationAmount;
  vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> chain;
  shared_ptr<Player> *bot_local;
  GameEngine *this_local;
  
  std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::vector
            ((vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> *)
             local_38);
  peVar7 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (in_RDX);
  sVar8 = Player::getPopulationsNumber(peVar7);
  for (tempPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _0_4_ = 0;
      (int)tempPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi < (int)sVar8;
      tempPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = (int)tempPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 1) {
    peVar7 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (in_RDX);
    Player::getPopulation
              ((Player *)&link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (int32_t)peVar7);
    p_Var1 = &link.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<Population>::shared_ptr
              ((shared_ptr<Population> *)local_60,(shared_ptr<Population> *)p_Var1);
    std::shared_ptr<Population>::~shared_ptr((shared_ptr<Population> *)p_Var1);
    std::shared_ptr<Handler>::shared_ptr((shared_ptr<Handler> *)&y);
    peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_60);
    iVar3 = Population::GetXPos(peVar9);
    peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_60);
    iVar4 = Population::GetYPos(peVar9);
    std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&handlerType);
    pRVar10 = RandomGenerator::getInstance();
    local_a0 = RandomGenerator::randInt(pRVar10,1,2);
    peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_60);
    iVar5 = Population::GetAnimalAmount(peVar9);
    iVar2 = iVar5 * 10;
    this_00 = Config::getInstance();
    peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_60);
    TVar6 = Population::GetType(peVar9);
    peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_60);
    size = Population::GetSize(peVar9);
    iVar5 = Config::getMaxAmount(this_00,TVar6,size);
    if (iVar2 != iVar5 * 9 && SBORROW4(iVar2,iVar5 * 9) == iVar2 + iVar5 * -9 < 0) {
      local_a0 = 3;
    }
    if (local_a0 == 1) {
      pRVar10 = RandomGenerator::getInstance();
      local_9c = RandomGenerator::randInt(pRVar10,0,3);
      switch(local_9c) {
      case 0:
        std::make_shared<CoverMutationHandler>();
        std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_b0);
        std::shared_ptr<CoverMutationHandler>::~shared_ptr(&local_b0);
        break;
      case 1:
        std::make_shared<SafetyMutationHandler>();
        std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_c0);
        std::shared_ptr<SafetyMutationHandler>::~shared_ptr(&local_c0);
        break;
      case 2:
        std::make_shared<SizeMutationHandler>();
        std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_d0);
        std::shared_ptr<SizeMutationHandler>::~shared_ptr(&local_d0);
        break;
      case 3:
        std::make_shared<VelocityMutationHandler>();
        std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_e0);
        std::shared_ptr<VelocityMutationHandler>::~shared_ptr(&local_e0);
      }
      peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )&y);
      std::shared_ptr<Population>::shared_ptr(&local_f0,(shared_ptr<Population> *)local_60);
      Handler::setPopulation(peVar16,&local_f0);
      std::shared_ptr<Population>::~shared_ptr(&local_f0);
    }
    else if (local_a0 == 2) {
      std::make_shared<MoveHandler>();
      std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_100);
      std::shared_ptr<MoveHandler>::~shared_ptr(&local_100);
      std::shared_ptr<Population>::shared_ptr(&local_118,(shared_ptr<Population> *)local_60);
      local_108 = getDestinationPos((GameEngine *)bot,&local_118);
      std::pair<int,_int>::operator=((pair<int,_int> *)&handlerType,&local_108);
      std::shared_ptr<Population>::~shared_ptr(&local_118);
      pos.second = handlerType;
      pos.first = mutationType;
      peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )&y);
      (**peVar16->_vptr_Handler)
                (peVar16,(ulong)(uint)(iVar3 + pos.second),(ulong)(uint)(iVar4 + pos.first));
      peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )&y);
      std::shared_ptr<Population>::shared_ptr(&local_128,(shared_ptr<Population> *)local_60);
      Handler::setPopulation(peVar16,&local_128);
      std::shared_ptr<Population>::~shared_ptr(&local_128);
      peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                          ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)bot
                          );
      pvVar13 = Map::operator[](peVar12,(long)iVar4);
      p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar13,(long)iVar3);
      peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var14);
      std::shared_ptr<Population>::shared_ptr(&local_138,(nullptr_t)0x0);
      CellType::setCurrentPopulation(peVar15,&local_138);
      std::shared_ptr<Population>::~shared_ptr(&local_138);
      peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                          ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)bot
                          );
      pvVar13 = Map::operator[](peVar12,(long)(iVar4 + pos.first));
      p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](pvVar13,(long)(iVar3 + pos.second));
      peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(p_Var14);
      std::shared_ptr<Population>::shared_ptr(&local_148,(shared_ptr<Population> *)local_60);
      CellType::setCurrentPopulation(peVar15,&local_148);
      std::shared_ptr<Population>::~shared_ptr(&local_148);
      peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_60);
      TVar6 = Population::GetType(peVar9);
      if (TVar6 == HERBIVORE) {
        peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                            ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             bot);
        pvVar13 = Map::operator[](peVar12,(long)iVar4);
        p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar13,(long)iVar3);
        peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var14);
        CellType::setHerbivoreCount(peVar15,0);
        peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                            ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             bot);
        pvVar13 = Map::operator[](peVar12,(long)(iVar4 + pos.first));
        p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar13,(long)(iVar3 + pos.second));
        peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var14);
        CellType::setHerbivoreCount(peVar15,1);
      }
      else {
        peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                            ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             bot);
        pvVar13 = Map::operator[](peVar12,(long)iVar4);
        p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar13,(long)iVar3);
        peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var14);
        CellType::setCarnivoreCount(peVar15,0);
        peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                            ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             bot);
        pvVar13 = Map::operator[](peVar12,(long)(iVar4 + pos.first));
        p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar13,(long)(iVar3 + pos.second));
        peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var14);
        CellType::setCarnivoreCount(peVar15,1);
      }
    }
    else if (local_a0 == 3) {
      std::shared_ptr<Population>::shared_ptr(&local_160,(shared_ptr<Population> *)local_60);
      local_150 = getDestinationPos((GameEngine *)bot,&local_160);
      std::pair<int,_int>::operator=((pair<int,_int> *)&handlerType,&local_150);
      std::shared_ptr<Population>::~shared_ptr(&local_160);
      pos.second = handlerType;
      pos.first = mutationType;
      if ((handlerType == 0) && (mutationType == 0)) {
        std::make_shared<VelocityMutationHandler>();
        std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_170);
        std::shared_ptr<VelocityMutationHandler>::~shared_ptr(&local_170);
        peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&y);
        p_Var1 = &newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::shared_ptr<Population>::shared_ptr
                  ((shared_ptr<Population> *)p_Var1,(shared_ptr<Population> *)local_60);
        Handler::setPopulation(peVar16,(shared_ptr<Population> *)p_Var1);
        std::shared_ptr<Population>::~shared_ptr
                  ((shared_ptr<Population> *)
                   &newPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                  ((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_60);
        std::make_shared<Population,Population&>((Population *)local_190);
        peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_190);
        peVar11 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_190);
        iVar5 = Population::GetAnimalAmount(peVar11);
        Population::SetAnimalAmount(peVar9,iVar5 / 2);
        peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        peVar11 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_60);
        iVar5 = Population::GetAnimalAmount(peVar11);
        Population::SetAnimalAmount(peVar9,iVar5 / 2);
        std::make_shared<MoveHandler>();
        std::shared_ptr<Handler>::operator=((shared_ptr<Handler> *)&y,&local_1a0);
        std::shared_ptr<MoveHandler>::~shared_ptr(&local_1a0);
        peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&y);
        (**peVar16->_vptr_Handler)
                  (peVar16,(ulong)(uint)(iVar3 + pos.second),(ulong)(uint)(iVar4 + pos.first));
        peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&y);
        std::shared_ptr<Population>::shared_ptr(&local_1b0,(shared_ptr<Population> *)local_190);
        Handler::setPopulation(peVar16,&local_1b0);
        std::shared_ptr<Population>::~shared_ptr(&local_1b0);
        peVar7 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(in_RDX);
        std::shared_ptr<Population>::shared_ptr(&local_1c0,(shared_ptr<Population> *)local_190);
        Player::addNewPopulation(peVar7,&local_1c0);
        std::shared_ptr<Population>::~shared_ptr(&local_1c0);
        peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                            ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             bot);
        pvVar13 = Map::operator[](peVar12,(long)(iVar4 + pos.first));
        p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                  operator[](pvVar13,(long)(iVar3 + pos.second));
        peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var14);
        std::shared_ptr<Population>::shared_ptr(&local_1d0,(shared_ptr<Population> *)local_190);
        CellType::setCurrentPopulation(peVar15,&local_1d0);
        std::shared_ptr<Population>::~shared_ptr(&local_1d0);
        peVar9 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        TVar6 = Population::GetType(peVar9);
        if (TVar6 == HERBIVORE) {
          peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator*((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              bot);
          pvVar13 = Map::operator[](peVar12,(long)(iVar4 + pos.first));
          p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    std::
                    vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                    operator[](pvVar13,(long)(iVar3 + pos.second));
          peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(p_Var14);
          CellType::setHerbivoreCount(peVar15,1);
        }
        else {
          peVar12 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator*((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              bot);
          pvVar13 = Map::operator[](peVar12,(long)(iVar4 + pos.first));
          p_Var14 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    std::
                    vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::
                    operator[](pvVar13,(long)(iVar3 + pos.second));
          peVar15 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(p_Var14);
          CellType::setCarnivoreCount(peVar15,1);
        }
        std::shared_ptr<Population>::~shared_ptr((shared_ptr<Population> *)local_190);
      }
    }
    std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::push_back
              ((vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> *)
               local_38,(value_type *)&y);
    if (0 < (int)tempPopulation.super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi) {
      this_01 = (__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::
                operator[]((vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                            *)local_38,
                           (long)((int)tempPopulation.
                                       super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi + -1));
      peVar16 = std::__shared_ptr_access<Handler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_01);
      pvVar17 = std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::
                operator[]((vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                            *)local_38,
                           (long)(int)tempPopulation.
                                      super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
      std::shared_ptr<Handler>::shared_ptr(&local_1e0,pvVar17);
      Handler::setNext(peVar16,&local_1e0);
      std::shared_ptr<Handler>::~shared_ptr(&local_1e0);
    }
    std::shared_ptr<Handler>::~shared_ptr((shared_ptr<Handler> *)&y);
    std::shared_ptr<Population>::~shared_ptr((shared_ptr<Population> *)local_60);
  }
  pvVar17 = std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::
            operator[]((vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>
                        *)local_38,0);
  std::shared_ptr<Handler>::shared_ptr((shared_ptr<Handler> *)this,pvVar17);
  std::vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_>::~vector
            ((vector<std::shared_ptr<Handler>,_std::allocator<std::shared_ptr<Handler>_>_> *)
             local_38);
  sVar18.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar18.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Handler>)sVar18.super___shared_ptr<Handler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Handler> GameEngine::generateBotHandlersChain(std::shared_ptr<Player> bot) {
  std::vector<std::shared_ptr<Handler> > chain;
  int32_t populationAmount = bot->getPopulationsNumber();
  for (int32_t i = 0; i < populationAmount; ++i) {
    std::shared_ptr<Population> tempPopulation = std::move(bot->getPopulation(i));
    std::shared_ptr<Handler> link;
    int32_t x = tempPopulation->GetXPos();
    int32_t y = tempPopulation->GetYPos();
    int32_t dX, dY;
    std::pair<int32_t, int32_t> pos;
    int32_t mutationType;
    int32_t handlerType = RandomGenerator::getInstance().randInt(1, 2);
    if (tempPopulation->GetAnimalAmount() * 10
        > Config::getInstance().getMaxAmount(tempPopulation->GetType(), tempPopulation->GetSize()) * 9) {
    handlerType = 3;
    }
    switch (handlerType) {
      case 1:mutationType = RandomGenerator::getInstance().randInt(0, 3);
        switch (mutationType) {
          case 0:link = std::make_shared<CoverMutationHandler>();
            break;
          case 1:link = std::make_shared<SafetyMutationHandler>();
            break;
          case 2:link = std::make_shared<SizeMutationHandler>();
            break;
          case 3:link = std::make_shared<VelocityMutationHandler>();
            break;
        }
        link->setPopulation(tempPopulation);
        break;
      case 2:link = std::make_shared<MoveHandler>();
        pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        link->setXYPos(x + dX, y + dY);
        link->setPopulation(tempPopulation);
        (*map)[y][x]->setCurrentPopulation(nullptr);
        (*map)[y + dY][x + dX]->setCurrentPopulation(tempPopulation);
        if (tempPopulation->GetType() == Population::HERBIVORE) {
          (*map)[y][x]->setHerbivoreCount(0);
          (*map)[y + dY][x + dX]->setHerbivoreCount(1);
        } else {
          (*map)[y][x]->setCarnivoreCount(0);
          (*map)[y + dY][x + dX]->setCarnivoreCount(1);
        }
        break;
      case 3:pos = getDestinationPos(tempPopulation);
        dX = pos.first;
        dY = pos.second;
        if (dX == 0 && dY == 0) {
          link = std::make_shared<VelocityMutationHandler>();
          link->setPopulation(tempPopulation);
        } else {
          std::shared_ptr<Population> newPopulation = std::make_shared<Population>(*(tempPopulation));
          newPopulation->SetAnimalAmount(newPopulation->GetAnimalAmount() / 2);
          tempPopulation->SetAnimalAmount(tempPopulation->GetAnimalAmount() / 2);
          link = std::make_shared<MoveHandler>();
          link->setXYPos(x + dX, y + dY);
          link->setPopulation(newPopulation);
          bot->addNewPopulation(newPopulation);
          (*map)[y + dY][x + dX]->setCurrentPopulation(newPopulation);
          if (tempPopulation->GetType() == Population::HERBIVORE) {
            (*map)[y + dY][x + dX]->setHerbivoreCount(1);
          } else {
            (*map)[y + dY][x + dX]->setCarnivoreCount(1);
          }
        }
        break;
    }
    chain.push_back(link);
    if (i > 0) {
      chain[i - 1]->setNext(chain[i]);
    }
  }
  return chain[0];
}